

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O3

void __thiscall de::BlockBuffer<unsigned_char>::flush(BlockBuffer<unsigned_char> *this)

{
  deMutex_lock((this->m_writeLock).m_mutex);
  if (0 < this->m_writePos) {
    this->m_numUsedInBlock[this->m_writeBlock] = this->m_writePos;
    this->m_writeBlock = (this->m_writeBlock + 1) % this->m_numBlocks;
    this->m_writePos = 0;
    deSemaphore_increment(this->m_fill);
  }
  deMutex_unlock((this->m_writeLock).m_mutex);
  return;
}

Assistant:

void BlockBuffer<T>::flush (void)
{
	m_writeLock.lock();

	if (m_writePos > 0)
		flushWriteBlock();

	m_writeLock.unlock();
}